

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O2

void test_construct_from_double<true>(void)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  AssertionResult gtest_ar;
  unsigned_long local_20;
  int local_18 [2];
  
  local_20 = 0x13ae147ae147ae;
  local_18[0] = -0x34;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ae147ae147ae;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"v.f","0x13ae147ae147aeu",&local_20,(unsigned_long *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.ptr_._0_4_ = 0xffffffcc;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"v.e","-52",local_18,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void test_construct_from_double<true>() {
  auto v = fp(1.23);
  EXPECT_EQ(v.f, 0x13ae147ae147aeu);
  EXPECT_EQ(v.e, -52);
}